

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<8,_1048576,_false,_embree::avx::ArrayIntersector1<embree::avx::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  Scene *pSVar2;
  float **ppfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  Geometry *pGVar8;
  RTCIntersectArguments *pRVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  bool bVar56;
  ulong *puVar57;
  ulong uVar58;
  long lVar59;
  int iVar60;
  long lVar61;
  ulong uVar62;
  ulong uVar63;
  ulong uVar64;
  undefined4 uVar65;
  ulong unaff_R12;
  size_t mask;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  ulong uVar69;
  bool bVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  float fVar74;
  undefined1 auVar75 [16];
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  float fVar79;
  float fVar83;
  undefined1 auVar78 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar91;
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  float fVar92;
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  float fVar93;
  float fVar99;
  float fVar100;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar102;
  float fVar103;
  float fVar104;
  undefined1 auVar97 [32];
  float fVar101;
  undefined1 auVar98 [32];
  float fVar105;
  float fVar106;
  float fVar112;
  float fVar114;
  float fVar116;
  undefined1 auVar107 [16];
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  float fVar113;
  float fVar115;
  float fVar117;
  undefined1 auVar111 [32];
  float fVar121;
  float fVar122;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar137;
  float fVar145;
  float fVar146;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar148;
  float fVar149;
  float fVar150;
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  float fVar147;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  float fVar160;
  float fVar161;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar164 [32];
  float fVar177;
  undefined1 auVar178 [32];
  float fVar188;
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  undefined1 auVar181 [64];
  undefined1 auVar189 [32];
  undefined1 auVar190 [64];
  float fVar191;
  undefined1 auVar192 [32];
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  undefined1 auVar193 [64];
  float fVar200;
  float fVar201;
  undefined1 auVar202 [32];
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  undefined1 auVar203 [64];
  undefined1 auVar216 [32];
  undefined1 auVar217 [64];
  undefined1 auVar218 [32];
  undefined1 auVar219 [64];
  float fVar220;
  float fVar221;
  undefined1 auVar222 [32];
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  undefined1 auVar223 [64];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  int local_175c;
  ulong local_1758;
  ulong *local_1750;
  ulong local_1748;
  ulong local_1740;
  ulong local_1738;
  ulong local_1730;
  ulong local_1728;
  undefined4 local_1720;
  undefined4 local_171c;
  undefined4 local_1718;
  undefined4 local_1714;
  undefined4 local_1710;
  undefined4 local_170c;
  uint local_1708;
  uint local_1704;
  uint local_1700;
  RTCFilterFunctionNArguments local_16f0;
  undefined8 local_16c0;
  float fStack_16b8;
  float fStack_16b4;
  float fStack_16b0;
  float fStack_16ac;
  float fStack_16a8;
  float fStack_16a4;
  undefined1 local_16a0 [32];
  float local_1680;
  float fStack_167c;
  float fStack_1678;
  float fStack_1674;
  float fStack_1670;
  float fStack_166c;
  float fStack_1668;
  float fStack_1664;
  undefined1 local_1660 [32];
  undefined1 local_1640 [32];
  undefined1 local_1620 [32];
  undefined1 local_1600 [32];
  undefined1 local_15e0 [32];
  undefined1 local_15c0 [32];
  undefined1 local_15a0 [32];
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  float local_13a0;
  float fStack_139c;
  float fStack_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float fStack_1388;
  float fStack_1384;
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  ulong local_1200;
  ulong local_11f8 [569];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar106 = ray->tfar;
    if (0.0 <= fVar106) {
      local_1750 = local_11f8;
      aVar1 = (ray->dir).field_0;
      auVar71 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar72._8_4_ = 0x7fffffff;
      auVar72._0_8_ = 0x7fffffff7fffffff;
      auVar72._12_4_ = 0x7fffffff;
      auVar72 = vandps_avx((undefined1  [16])aVar1,auVar72);
      auVar123._8_4_ = 0x219392ef;
      auVar123._0_8_ = 0x219392ef219392ef;
      auVar123._12_4_ = 0x219392ef;
      auVar72 = vcmpps_avx(auVar72,auVar123,1);
      auVar72 = vblendvps_avx((undefined1  [16])aVar1,auVar123,auVar72);
      auVar123 = vrcpps_avx(auVar72);
      fVar105 = auVar123._0_4_;
      auVar94._0_4_ = fVar105 * auVar72._0_4_;
      fVar112 = auVar123._4_4_;
      auVar94._4_4_ = fVar112 * auVar72._4_4_;
      fVar114 = auVar123._8_4_;
      auVar94._8_4_ = fVar114 * auVar72._8_4_;
      fVar116 = auVar123._12_4_;
      auVar94._12_4_ = fVar116 * auVar72._12_4_;
      auVar124._8_4_ = 0x3f800000;
      auVar124._0_8_ = &DAT_3f8000003f800000;
      auVar124._12_4_ = 0x3f800000;
      auVar72 = vsubps_avx(auVar124,auVar94);
      uVar65 = *(undefined4 *)&(ray->org).field_0;
      local_15a0._4_4_ = uVar65;
      local_15a0._0_4_ = uVar65;
      local_15a0._8_4_ = uVar65;
      local_15a0._12_4_ = uVar65;
      local_15a0._16_4_ = uVar65;
      local_15a0._20_4_ = uVar65;
      local_15a0._24_4_ = uVar65;
      local_15a0._28_4_ = uVar65;
      auVar181 = ZEXT3264(local_15a0);
      uVar65 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_15c0._4_4_ = uVar65;
      local_15c0._0_4_ = uVar65;
      local_15c0._8_4_ = uVar65;
      local_15c0._12_4_ = uVar65;
      local_15c0._16_4_ = uVar65;
      local_15c0._20_4_ = uVar65;
      local_15c0._24_4_ = uVar65;
      local_15c0._28_4_ = uVar65;
      auVar190 = ZEXT3264(local_15c0);
      uVar65 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_15e0._4_4_ = uVar65;
      local_15e0._0_4_ = uVar65;
      local_15e0._8_4_ = uVar65;
      local_15e0._12_4_ = uVar65;
      local_15e0._16_4_ = uVar65;
      local_15e0._20_4_ = uVar65;
      local_15e0._24_4_ = uVar65;
      local_15e0._28_4_ = uVar65;
      auVar193 = ZEXT3264(local_15e0);
      auVar95._0_4_ = fVar105 + fVar105 * auVar72._0_4_;
      auVar95._4_4_ = fVar112 + fVar112 * auVar72._4_4_;
      auVar95._8_4_ = fVar114 + fVar114 * auVar72._8_4_;
      auVar95._12_4_ = fVar116 + fVar116 * auVar72._12_4_;
      local_1200 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar72 = vshufps_avx(auVar95,auVar95,0);
      local_1600._16_16_ = auVar72;
      local_1600._0_16_ = auVar72;
      auVar203 = ZEXT3264(local_1600);
      auVar72 = vmovshdup_avx(auVar95);
      auVar123 = vshufps_avx(auVar95,auVar95,0x55);
      local_1620._16_16_ = auVar123;
      local_1620._0_16_ = auVar123;
      auVar217 = ZEXT3264(local_1620);
      auVar123 = vshufpd_avx(auVar95,auVar95,1);
      auVar94 = vshufps_avx(auVar95,auVar95,0xaa);
      local_1640._16_16_ = auVar94;
      local_1640._0_16_ = auVar94;
      auVar219 = ZEXT3264(local_1640);
      auVar71 = vshufps_avx(auVar71,auVar71,0);
      local_1660._16_16_ = auVar71;
      local_1660._0_16_ = auVar71;
      auVar223 = ZEXT3264(local_1660);
      auVar71 = vshufps_avx(ZEXT416((uint)fVar106),ZEXT416((uint)fVar106),0);
      local_1420._16_16_ = auVar71;
      local_1420._0_16_ = auVar71;
      local_1758 = (ulong)(auVar95._0_4_ < 0.0) << 3;
      uVar63 = local_1758 ^ 8;
      uVar68 = (ulong)((uint)(auVar72._0_4_ < 0.0) * 8 + 0x10);
      uVar69 = uVar68 ^ 8;
      uVar64 = (ulong)((uint)(auVar123._0_4_ < 0.0) * 8 + 0x20);
      local_1580._0_16_ = mm_lookupmask_ps._0_16_;
      local_1580._16_16_ = mm_lookupmask_ps._240_16_;
      local_1748 = uVar69;
      local_1740 = uVar68;
      local_1738 = uVar63;
      do {
        if (local_1750 == &local_1200) {
          return;
        }
        uVar67 = local_1750[-1];
        local_1750 = local_1750 + -1;
        do {
          if ((uVar67 & 8) == 0) {
            puVar57 = (ulong *)((uVar67 & 0xfffffffffffffff0) + 0x40);
            if ((uVar67 & 0xfffffffffffffff0) == 0) {
              puVar57 = (ulong *)0x0;
            }
            auVar71._8_8_ = 0;
            auVar71._0_8_ = *puVar57;
            auVar84._8_8_ = 0;
            auVar84._0_8_ = puVar57[1];
            auVar72 = vpminub_avx(auVar71,auVar84);
            auVar72 = vpcmpeqb_avx(auVar71,auVar72);
            auVar75._8_8_ = 0;
            auVar75._0_8_ = *(ulong *)((long)puVar57 + 4);
            auVar96._8_8_ = 0;
            auVar96._0_8_ = *(ulong *)((long)puVar57 + 0xc);
            auVar71 = vpminub_avx(auVar75,auVar96);
            auVar71 = vpcmpeqb_avx(auVar75,auVar71);
            fVar106 = *(float *)(puVar57 + 6);
            fVar105 = *(float *)((long)puVar57 + 0x3c);
            auVar85._8_8_ = 0;
            auVar85._0_8_ = *(ulong *)((long)puVar57 + local_1758);
            auVar123 = vpmovzxbd_avx(auVar85);
            auVar125._8_8_ = 0;
            auVar125._0_8_ = *(ulong *)((long)puVar57 + local_1758 + 4);
            auVar94 = vpmovzxbd_avx(auVar125);
            auVar86._16_16_ = auVar94;
            auVar86._0_16_ = auVar123;
            auVar86 = vcvtdq2ps_avx(auVar86);
            auVar87._0_4_ = fVar106 + fVar105 * auVar86._0_4_;
            auVar87._4_4_ = fVar106 + fVar105 * auVar86._4_4_;
            auVar87._8_4_ = fVar106 + fVar105 * auVar86._8_4_;
            auVar87._12_4_ = fVar106 + fVar105 * auVar86._12_4_;
            auVar87._16_4_ = fVar106 + fVar105 * auVar86._16_4_;
            auVar87._20_4_ = fVar106 + fVar105 * auVar86._20_4_;
            auVar87._24_4_ = fVar106 + fVar105 * auVar86._24_4_;
            auVar87._28_4_ = fVar106 + auVar86._28_4_;
            auVar126._8_8_ = 0;
            auVar126._0_8_ = *(ulong *)((long)puVar57 + uVar63);
            auVar123 = vpmovzxbd_avx(auVar126);
            auVar138._8_8_ = 0;
            auVar138._0_8_ = *(ulong *)((long)puVar57 + uVar63 + 4);
            auVar94 = vpmovzxbd_avx(auVar138);
            auVar127._16_16_ = auVar94;
            auVar127._0_16_ = auVar123;
            auVar86 = vcvtdq2ps_avx(auVar127);
            auVar97._0_4_ = fVar106 + fVar105 * auVar86._0_4_;
            auVar97._4_4_ = fVar106 + fVar105 * auVar86._4_4_;
            auVar97._8_4_ = fVar106 + fVar105 * auVar86._8_4_;
            auVar97._12_4_ = fVar106 + fVar105 * auVar86._12_4_;
            auVar97._16_4_ = fVar106 + fVar105 * auVar86._16_4_;
            auVar97._20_4_ = fVar106 + fVar105 * auVar86._20_4_;
            auVar97._24_4_ = fVar106 + fVar105 * auVar86._24_4_;
            auVar97._28_4_ = fVar106 + fVar105;
            fVar106 = *(float *)((long)puVar57 + 0x34);
            fVar105 = *(float *)(puVar57 + 8);
            auVar107._8_8_ = 0;
            auVar107._0_8_ = *(ulong *)((long)puVar57 + uVar68);
            auVar123 = vpmovzxbd_avx(auVar107);
            auVar151._8_8_ = 0;
            auVar151._0_8_ = *(ulong *)((long)puVar57 + uVar68 + 4);
            auVar94 = vpmovzxbd_avx(auVar151);
            auVar108._16_16_ = auVar94;
            auVar108._0_16_ = auVar123;
            auVar86 = vcvtdq2ps_avx(auVar108);
            auVar109._0_4_ = fVar106 + fVar105 * auVar86._0_4_;
            auVar109._4_4_ = fVar106 + fVar105 * auVar86._4_4_;
            auVar109._8_4_ = fVar106 + fVar105 * auVar86._8_4_;
            auVar109._12_4_ = fVar106 + fVar105 * auVar86._12_4_;
            auVar109._16_4_ = fVar106 + fVar105 * auVar86._16_4_;
            auVar109._20_4_ = fVar106 + fVar105 * auVar86._20_4_;
            auVar109._24_4_ = fVar106 + fVar105 * auVar86._24_4_;
            auVar109._28_4_ = fVar106 + auVar86._28_4_;
            auVar152._8_8_ = 0;
            auVar152._0_8_ = *(ulong *)((long)puVar57 + uVar69);
            auVar123 = vpmovzxbd_avx(auVar152);
            auVar162._8_8_ = 0;
            auVar162._0_8_ = *(ulong *)((long)puVar57 + uVar69 + 4);
            auVar94 = vpmovzxbd_avx(auVar162);
            auVar155._16_16_ = auVar94;
            auVar155._0_16_ = auVar123;
            auVar86 = vcvtdq2ps_avx(auVar155);
            auVar128._0_4_ = fVar106 + fVar105 * auVar86._0_4_;
            auVar128._4_4_ = fVar106 + fVar105 * auVar86._4_4_;
            auVar128._8_4_ = fVar106 + fVar105 * auVar86._8_4_;
            auVar128._12_4_ = fVar106 + fVar105 * auVar86._12_4_;
            auVar128._16_4_ = fVar106 + fVar105 * auVar86._16_4_;
            auVar128._20_4_ = fVar106 + fVar105 * auVar86._20_4_;
            auVar128._24_4_ = fVar106 + fVar105 * auVar86._24_4_;
            auVar128._28_4_ = fVar106 + fVar105;
            auVar139._8_8_ = 0;
            auVar139._0_8_ = *(ulong *)((long)puVar57 + uVar64);
            auVar123 = vpmovzxbd_avx(auVar139);
            auVar153._8_8_ = 0;
            auVar153._0_8_ = *(ulong *)((long)puVar57 + uVar64 + 4);
            auVar94 = vpmovzxbd_avx(auVar153);
            auVar140._16_16_ = auVar94;
            auVar140._0_16_ = auVar123;
            auVar154._8_8_ = 0;
            auVar154._0_8_ = *(ulong *)((long)puVar57 + (uVar64 ^ 8));
            auVar123 = vpmovzxbd_avx(auVar154);
            auVar163._8_8_ = 0;
            auVar163._0_8_ = *(ulong *)((long)puVar57 + (uVar64 ^ 8) + 4);
            auVar94 = vpmovzxbd_avx(auVar163);
            auVar156._16_16_ = auVar94;
            auVar156._0_16_ = auVar123;
            fVar106 = *(float *)((long)puVar57 + 0x44);
            auVar86 = vcvtdq2ps_avx(auVar140);
            auVar15 = vcvtdq2ps_avx(auVar156);
            fVar105 = *(float *)(puVar57 + 7);
            auVar141._0_4_ = fVar105 + fVar106 * auVar86._0_4_;
            auVar141._4_4_ = fVar105 + fVar106 * auVar86._4_4_;
            auVar141._8_4_ = fVar105 + fVar106 * auVar86._8_4_;
            auVar141._12_4_ = fVar105 + fVar106 * auVar86._12_4_;
            auVar141._16_4_ = fVar105 + fVar106 * auVar86._16_4_;
            auVar141._20_4_ = fVar105 + fVar106 * auVar86._20_4_;
            auVar141._24_4_ = fVar105 + fVar106 * auVar86._24_4_;
            auVar141._28_4_ = fVar105 + auVar86._28_4_;
            auVar157._0_4_ = fVar105 + fVar106 * auVar15._0_4_;
            auVar157._4_4_ = fVar105 + fVar106 * auVar15._4_4_;
            auVar157._8_4_ = fVar105 + fVar106 * auVar15._8_4_;
            auVar157._12_4_ = fVar105 + fVar106 * auVar15._12_4_;
            auVar157._16_4_ = fVar105 + fVar106 * auVar15._16_4_;
            auVar157._20_4_ = fVar105 + fVar106 * auVar15._20_4_;
            auVar157._24_4_ = fVar105 + fVar106 * auVar15._24_4_;
            auVar157._28_4_ = fVar105 + auVar15._28_4_;
            auVar86 = vsubps_avx(auVar87,auVar181._0_32_);
            auVar15._4_4_ = auVar203._4_4_ * auVar86._4_4_;
            auVar15._0_4_ = auVar203._0_4_ * auVar86._0_4_;
            auVar15._8_4_ = auVar203._8_4_ * auVar86._8_4_;
            auVar15._12_4_ = auVar203._12_4_ * auVar86._12_4_;
            auVar15._16_4_ = auVar203._16_4_ * auVar86._16_4_;
            auVar15._20_4_ = auVar203._20_4_ * auVar86._20_4_;
            auVar15._24_4_ = auVar203._24_4_ * auVar86._24_4_;
            auVar15._28_4_ = auVar86._28_4_;
            auVar86 = vsubps_avx(auVar109,auVar190._0_32_);
            auVar16._4_4_ = auVar217._4_4_ * auVar86._4_4_;
            auVar16._0_4_ = auVar217._0_4_ * auVar86._0_4_;
            auVar16._8_4_ = auVar217._8_4_ * auVar86._8_4_;
            auVar16._12_4_ = auVar217._12_4_ * auVar86._12_4_;
            auVar16._16_4_ = auVar217._16_4_ * auVar86._16_4_;
            auVar16._20_4_ = auVar217._20_4_ * auVar86._20_4_;
            auVar16._24_4_ = auVar217._24_4_ * auVar86._24_4_;
            auVar16._28_4_ = auVar86._28_4_;
            auVar86 = vmaxps_avx(auVar15,auVar16);
            auVar15 = vsubps_avx(auVar141,auVar193._0_32_);
            auVar17._4_4_ = auVar219._4_4_ * auVar15._4_4_;
            auVar17._0_4_ = auVar219._0_4_ * auVar15._0_4_;
            auVar17._8_4_ = auVar219._8_4_ * auVar15._8_4_;
            auVar17._12_4_ = auVar219._12_4_ * auVar15._12_4_;
            auVar17._16_4_ = auVar219._16_4_ * auVar15._16_4_;
            auVar17._20_4_ = auVar219._20_4_ * auVar15._20_4_;
            auVar17._24_4_ = auVar219._24_4_ * auVar15._24_4_;
            auVar17._28_4_ = auVar15._28_4_;
            auVar15 = vmaxps_avx(auVar17,auVar223._0_32_);
            auVar86 = vmaxps_avx(auVar86,auVar15);
            auVar15 = vsubps_avx(auVar97,auVar181._0_32_);
            auVar18._4_4_ = auVar203._4_4_ * auVar15._4_4_;
            auVar18._0_4_ = auVar203._0_4_ * auVar15._0_4_;
            auVar18._8_4_ = auVar203._8_4_ * auVar15._8_4_;
            auVar18._12_4_ = auVar203._12_4_ * auVar15._12_4_;
            auVar18._16_4_ = auVar203._16_4_ * auVar15._16_4_;
            auVar18._20_4_ = auVar203._20_4_ * auVar15._20_4_;
            auVar18._24_4_ = auVar203._24_4_ * auVar15._24_4_;
            auVar18._28_4_ = auVar15._28_4_;
            auVar15 = vsubps_avx(auVar128,auVar190._0_32_);
            auVar19._4_4_ = auVar217._4_4_ * auVar15._4_4_;
            auVar19._0_4_ = auVar217._0_4_ * auVar15._0_4_;
            auVar19._8_4_ = auVar217._8_4_ * auVar15._8_4_;
            auVar19._12_4_ = auVar217._12_4_ * auVar15._12_4_;
            auVar19._16_4_ = auVar217._16_4_ * auVar15._16_4_;
            auVar19._20_4_ = auVar217._20_4_ * auVar15._20_4_;
            auVar19._24_4_ = auVar217._24_4_ * auVar15._24_4_;
            auVar19._28_4_ = auVar15._28_4_;
            auVar15 = vminps_avx(auVar18,auVar19);
            auVar16 = vsubps_avx(auVar157,auVar193._0_32_);
            auVar20._4_4_ = auVar219._4_4_ * auVar16._4_4_;
            auVar20._0_4_ = auVar219._0_4_ * auVar16._0_4_;
            auVar20._8_4_ = auVar219._8_4_ * auVar16._8_4_;
            auVar20._12_4_ = auVar219._12_4_ * auVar16._12_4_;
            auVar20._16_4_ = auVar219._16_4_ * auVar16._16_4_;
            auVar20._20_4_ = auVar219._20_4_ * auVar16._20_4_;
            auVar20._24_4_ = auVar219._24_4_ * auVar16._24_4_;
            auVar20._28_4_ = auVar16._28_4_;
            auVar16 = vminps_avx(auVar20,local_1420);
            auVar15 = vminps_avx(auVar15,auVar16);
            auVar86 = vcmpps_avx(auVar86,auVar15,2);
            auVar123 = vpcmpeqd_avx(auVar15._0_16_,auVar15._0_16_);
            auVar72 = vpmovsxbd_avx(auVar72 ^ auVar123);
            auVar71 = vpmovsxbd_avx(auVar71 ^ auVar123);
            auVar73._16_16_ = auVar71;
            auVar73._0_16_ = auVar72;
            auVar15 = vcvtdq2ps_avx(auVar73);
            auVar76._8_4_ = 0xbf800000;
            auVar76._0_8_ = 0xbf800000bf800000;
            auVar76._12_4_ = 0xbf800000;
            auVar76._16_4_ = 0xbf800000;
            auVar76._20_4_ = 0xbf800000;
            auVar76._24_4_ = 0xbf800000;
            auVar76._28_4_ = 0xbf800000;
            auVar15 = vcmpps_avx(auVar76,auVar15,1);
            auVar86 = vandps_avx(auVar86,auVar15);
            uVar65 = vmovmskps_avx(auVar86);
            unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar65);
          }
          if ((uVar67 & 8) == 0) {
            if (unaff_R12 == 0) {
              iVar60 = 4;
            }
            else {
              uVar66 = uVar67 & 0xfffffffffffffff0;
              lVar61 = 0;
              if (unaff_R12 != 0) {
                for (; (unaff_R12 >> lVar61 & 1) == 0; lVar61 = lVar61 + 1) {
                }
              }
              iVar60 = 0;
              uVar67 = *(ulong *)(uVar66 + lVar61 * 8);
              uVar62 = unaff_R12 - 1 & unaff_R12;
              if (uVar62 != 0) {
                *local_1750 = uVar67;
                lVar61 = 0;
                if (uVar62 != 0) {
                  for (; (uVar62 >> lVar61 & 1) == 0; lVar61 = lVar61 + 1) {
                  }
                }
                uVar58 = uVar62 - 1;
                while( true ) {
                  local_1750 = local_1750 + 1;
                  uVar67 = *(ulong *)(uVar66 + lVar61 * 8);
                  uVar58 = uVar58 & uVar62;
                  if (uVar58 == 0) break;
                  *local_1750 = uVar67;
                  lVar61 = 0;
                  if (uVar58 != 0) {
                    for (; (uVar58 >> lVar61 & 1) == 0; lVar61 = lVar61 + 1) {
                    }
                  }
                  uVar62 = uVar58 - 1;
                }
                iVar60 = 0;
              }
            }
          }
          else {
            iVar60 = 6;
          }
        } while (iVar60 == 0);
        if (iVar60 == 6) {
          iVar60 = 0;
          local_1730 = (ulong)((uint)uVar67 & 0xf) - 8;
          bVar70 = local_1730 != 0;
          if (bVar70) {
            uVar67 = uVar67 & 0xfffffffffffffff0;
            pSVar2 = context->scene;
            local_1728 = 0;
            do {
              lVar59 = local_1728 * 0x60;
              ppfVar3 = (pSVar2->vertices).items;
              pfVar4 = ppfVar3[*(uint *)(uVar67 + 0x40 + lVar59)];
              pfVar5 = ppfVar3[*(uint *)(uVar67 + 0x44 + lVar59)];
              pfVar6 = ppfVar3[*(uint *)(uVar67 + 0x48 + lVar59)];
              pfVar7 = ppfVar3[*(uint *)(uVar67 + 0x4c + lVar59)];
              auVar123 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar67 + lVar59)),
                                       *(undefined1 (*) [16])
                                        (pfVar6 + *(uint *)(uVar67 + 8 + lVar59)));
              auVar72 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar67 + lVar59)),
                                      *(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar67 + 8 + lVar59)));
              auVar94 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar5 + *(uint *)(uVar67 + 4 + lVar59)),
                                      *(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar67 + 0xc + lVar59)));
              auVar71 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar5 + *(uint *)(uVar67 + 4 + lVar59)),
                                      *(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar67 + 0xc + lVar59)));
              auVar124 = vunpcklps_avx(auVar72,auVar71);
              auVar75 = vunpcklps_avx(auVar123,auVar94);
              auVar72 = vunpckhps_avx(auVar123,auVar94);
              auVar94 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar4 + *(uint *)(uVar67 + 0x10 + lVar59)),
                                      *(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar67 + 0x18 + lVar59)));
              auVar71 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar4 + *(uint *)(uVar67 + 0x10 + lVar59)),
                                      *(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar67 + 0x18 + lVar59)));
              auVar95 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar5 + *(uint *)(uVar67 + 0x14 + lVar59)),
                                      *(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar67 + 0x1c + lVar59)));
              auVar123 = vunpckhps_avx(*(undefined1 (*) [16])
                                        (pfVar5 + *(uint *)(uVar67 + 0x14 + lVar59)),
                                       *(undefined1 (*) [16])
                                        (pfVar7 + *(uint *)(uVar67 + 0x1c + lVar59)));
              auVar84 = vunpcklps_avx(auVar71,auVar123);
              auVar85 = vunpcklps_avx(auVar94,auVar95);
              auVar71 = vunpckhps_avx(auVar94,auVar95);
              auVar95 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar4 + *(uint *)(uVar67 + 0x20 + lVar59)),
                                      *(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar67 + 0x28 + lVar59)));
              auVar123 = vunpckhps_avx(*(undefined1 (*) [16])
                                        (pfVar4 + *(uint *)(uVar67 + 0x20 + lVar59)),
                                       *(undefined1 (*) [16])
                                        (pfVar6 + *(uint *)(uVar67 + 0x28 + lVar59)));
              auVar96 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar5 + *(uint *)(uVar67 + 0x24 + lVar59)),
                                      *(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar67 + 0x2c + lVar59)));
              auVar94 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar5 + *(uint *)(uVar67 + 0x24 + lVar59)),
                                      *(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar67 + 0x2c + lVar59)));
              auVar107 = vunpcklps_avx(auVar123,auVar94);
              auVar125 = vunpcklps_avx(auVar95,auVar96);
              auVar123 = vunpckhps_avx(auVar95,auVar96);
              auVar96 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar4 + *(uint *)(uVar67 + 0x30 + lVar59)),
                                      *(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar67 + 0x38 + lVar59)));
              auVar94 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar4 + *(uint *)(uVar67 + 0x30 + lVar59)),
                                      *(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar67 + 0x38 + lVar59)));
              auVar126 = vunpcklps_avx(*(undefined1 (*) [16])
                                        (pfVar5 + *(uint *)(uVar67 + 0x34 + lVar59)),
                                       *(undefined1 (*) [16])
                                        (pfVar7 + *(uint *)(uVar67 + 0x3c + lVar59)));
              auVar95 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar5 + *(uint *)(uVar67 + 0x34 + lVar59)),
                                      *(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar67 + 0x3c + lVar59)));
              auVar95 = vunpcklps_avx(auVar94,auVar95);
              auVar138 = vunpcklps_avx(auVar96,auVar126);
              lVar61 = uVar67 + 0x40 + lVar59;
              local_13e0 = *(undefined8 *)(lVar61 + 0x10);
              uStack_13d8 = *(undefined8 *)(lVar61 + 0x18);
              auVar94 = vunpckhps_avx(auVar96,auVar126);
              uStack_13d0 = local_13e0;
              uStack_13c8 = uStack_13d8;
              lVar59 = uVar67 + 0x50 + lVar59;
              local_1400 = *(undefined8 *)(lVar59 + 0x10);
              uStack_13f8 = *(undefined8 *)(lVar59 + 0x18);
              uStack_13f0 = local_1400;
              uStack_13e8 = uStack_13f8;
              auVar129._16_16_ = auVar125;
              auVar129._0_16_ = auVar75;
              auVar158._16_16_ = auVar123;
              auVar158._0_16_ = auVar72;
              auVar222._16_16_ = auVar107;
              auVar222._0_16_ = auVar124;
              auVar110._16_16_ = auVar85;
              auVar110._0_16_ = auVar85;
              auVar218._16_16_ = auVar71;
              auVar218._0_16_ = auVar71;
              auVar88._16_16_ = auVar84;
              auVar88._0_16_ = auVar84;
              auVar178._16_16_ = auVar138;
              auVar178._0_16_ = auVar138;
              auVar164._16_16_ = auVar94;
              auVar164._0_16_ = auVar94;
              auVar189._16_16_ = auVar95;
              auVar189._0_16_ = auVar95;
              uVar65 = *(undefined4 *)&(ray->org).field_0;
              auVar192._4_4_ = uVar65;
              auVar192._0_4_ = uVar65;
              auVar192._8_4_ = uVar65;
              auVar192._12_4_ = uVar65;
              auVar192._16_4_ = uVar65;
              auVar192._20_4_ = uVar65;
              auVar192._24_4_ = uVar65;
              auVar192._28_4_ = uVar65;
              uVar65 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
              auVar202._4_4_ = uVar65;
              auVar202._0_4_ = uVar65;
              auVar202._8_4_ = uVar65;
              auVar202._12_4_ = uVar65;
              auVar202._16_4_ = uVar65;
              auVar202._20_4_ = uVar65;
              auVar202._24_4_ = uVar65;
              auVar202._28_4_ = uVar65;
              uVar65 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
              auVar216._4_4_ = uVar65;
              auVar216._0_4_ = uVar65;
              auVar216._8_4_ = uVar65;
              auVar216._12_4_ = uVar65;
              auVar216._16_4_ = uVar65;
              auVar216._20_4_ = uVar65;
              auVar216._24_4_ = uVar65;
              auVar216._28_4_ = uVar65;
              local_1440 = vsubps_avx(auVar129,auVar192);
              local_1460 = vsubps_avx(auVar158,auVar202);
              local_1480 = vsubps_avx(auVar222,auVar216);
              auVar86 = vsubps_avx(auVar110,auVar192);
              auVar15 = vsubps_avx(auVar218,auVar202);
              auVar16 = vsubps_avx(auVar88,auVar216);
              auVar17 = vsubps_avx(auVar178,auVar192);
              auVar18 = vsubps_avx(auVar164,auVar202);
              auVar19 = vsubps_avx(auVar189,auVar216);
              local_14a0 = vsubps_avx(auVar17,local_1440);
              local_14c0 = vsubps_avx(auVar18,local_1460);
              local_14e0 = vsubps_avx(auVar19,local_1480);
              fVar105 = local_1460._0_4_;
              fVar106 = auVar18._0_4_ + fVar105;
              fVar114 = local_1460._4_4_;
              fVar113 = auVar18._4_4_ + fVar114;
              fVar10 = local_1460._8_4_;
              fVar115 = auVar18._8_4_ + fVar10;
              fVar79 = local_1460._12_4_;
              fVar117 = auVar18._12_4_ + fVar79;
              fVar81 = local_1460._16_4_;
              fVar118 = auVar18._16_4_ + fVar81;
              fVar83 = local_1460._20_4_;
              fVar119 = auVar18._20_4_ + fVar83;
              fVar13 = local_1460._24_4_;
              fVar120 = auVar18._24_4_ + fVar13;
              fVar74 = local_1460._28_4_;
              fVar220 = local_1480._0_4_;
              fVar121 = fVar220 + auVar19._0_4_;
              fVar224 = local_1480._4_4_;
              fVar130 = fVar224 + auVar19._4_4_;
              fVar226 = local_1480._8_4_;
              fVar132 = fVar226 + auVar19._8_4_;
              fVar228 = local_1480._12_4_;
              fVar133 = fVar228 + auVar19._12_4_;
              fVar230 = local_1480._16_4_;
              fVar134 = fVar230 + auVar19._16_4_;
              fVar232 = local_1480._20_4_;
              fVar135 = fVar232 + auVar19._20_4_;
              fVar234 = local_1480._24_4_;
              fVar136 = fVar234 + auVar19._24_4_;
              fVar91 = local_1480._28_4_;
              fVar137 = local_14e0._0_4_;
              fVar145 = local_14e0._4_4_;
              auVar21._4_4_ = fVar145 * fVar113;
              auVar21._0_4_ = fVar137 * fVar106;
              fVar146 = local_14e0._8_4_;
              auVar21._8_4_ = fVar146 * fVar115;
              fVar147 = local_14e0._12_4_;
              auVar21._12_4_ = fVar147 * fVar117;
              fVar148 = local_14e0._16_4_;
              auVar21._16_4_ = fVar148 * fVar118;
              fVar149 = local_14e0._20_4_;
              auVar21._20_4_ = fVar149 * fVar119;
              fVar150 = local_14e0._24_4_;
              auVar21._24_4_ = fVar150 * fVar120;
              auVar21._28_4_ = auVar94._12_4_;
              fVar200 = local_14c0._0_4_;
              fVar204 = local_14c0._4_4_;
              auVar22._4_4_ = fVar204 * fVar130;
              auVar22._0_4_ = fVar200 * fVar121;
              fVar206 = local_14c0._8_4_;
              auVar22._8_4_ = fVar206 * fVar132;
              fVar208 = local_14c0._12_4_;
              auVar22._12_4_ = fVar208 * fVar133;
              fVar210 = local_14c0._16_4_;
              auVar22._16_4_ = fVar210 * fVar134;
              fVar212 = local_14c0._20_4_;
              auVar22._20_4_ = fVar212 * fVar135;
              fVar214 = local_14c0._24_4_;
              auVar22._24_4_ = fVar214 * fVar136;
              auVar22._28_4_ = auVar138._12_4_;
              auVar20 = vsubps_avx(auVar22,auVar21);
              fVar112 = local_1440._0_4_;
              fVar177 = auVar17._0_4_ + fVar112;
              fVar116 = local_1440._4_4_;
              fVar182 = auVar17._4_4_ + fVar116;
              fVar11 = local_1440._8_4_;
              fVar183 = auVar17._8_4_ + fVar11;
              fVar80 = local_1440._12_4_;
              fVar184 = auVar17._12_4_ + fVar80;
              fVar82 = local_1440._16_4_;
              fVar185 = auVar17._16_4_ + fVar82;
              fVar12 = local_1440._20_4_;
              fVar186 = auVar17._20_4_ + fVar12;
              fVar14 = local_1440._24_4_;
              fVar187 = auVar17._24_4_ + fVar14;
              fVar191 = local_14a0._0_4_;
              fVar194 = local_14a0._4_4_;
              auVar23._4_4_ = fVar194 * fVar130;
              auVar23._0_4_ = fVar191 * fVar121;
              fVar195 = local_14a0._8_4_;
              auVar23._8_4_ = fVar195 * fVar132;
              fVar196 = local_14a0._12_4_;
              auVar23._12_4_ = fVar196 * fVar133;
              fVar197 = local_14a0._16_4_;
              auVar23._16_4_ = fVar197 * fVar134;
              fVar198 = local_14a0._20_4_;
              auVar23._20_4_ = fVar198 * fVar135;
              fVar199 = local_14a0._24_4_;
              auVar23._24_4_ = fVar199 * fVar136;
              auVar23._28_4_ = fVar91 + auVar19._28_4_;
              auVar24._4_4_ = fVar182 * fVar145;
              auVar24._0_4_ = fVar177 * fVar137;
              auVar24._8_4_ = fVar183 * fVar146;
              auVar24._12_4_ = fVar184 * fVar147;
              auVar24._16_4_ = fVar185 * fVar148;
              auVar24._20_4_ = fVar186 * fVar149;
              auVar24._24_4_ = fVar187 * fVar150;
              auVar24._28_4_ = auVar95._12_4_;
              auVar73 = vsubps_avx(auVar24,auVar23);
              auVar25._4_4_ = fVar204 * fVar182;
              auVar25._0_4_ = fVar200 * fVar177;
              auVar25._8_4_ = fVar206 * fVar183;
              auVar25._12_4_ = fVar208 * fVar184;
              auVar25._16_4_ = fVar210 * fVar185;
              auVar25._20_4_ = fVar212 * fVar186;
              auVar25._24_4_ = fVar214 * fVar187;
              auVar25._28_4_ = auVar17._28_4_ + local_1440._28_4_;
              auVar26._4_4_ = fVar194 * fVar113;
              auVar26._0_4_ = fVar191 * fVar106;
              auVar26._8_4_ = fVar195 * fVar115;
              auVar26._12_4_ = fVar196 * fVar117;
              auVar26._16_4_ = fVar197 * fVar118;
              auVar26._20_4_ = fVar198 * fVar119;
              auVar26._24_4_ = fVar199 * fVar120;
              auVar26._28_4_ = auVar18._28_4_ + fVar74;
              auVar76 = vsubps_avx(auVar26,auVar25);
              fStack_167c = (ray->dir).field_0.m128[1];
              fVar106 = (ray->dir).field_0.m128[2];
              local_16a0._4_4_ = fVar106;
              local_16a0._0_4_ = fVar106;
              local_16a0._8_4_ = fVar106;
              local_16a0._12_4_ = fVar106;
              local_16a0._16_4_ = fVar106;
              local_16a0._20_4_ = fVar106;
              local_16a0._24_4_ = fVar106;
              local_16a0._28_4_ = fVar106;
              local_16c0._4_4_ = (ray->dir).field_0.m128[0];
              local_1520._0_4_ =
                   local_16c0._4_4_ * auVar20._0_4_ +
                   fStack_167c * auVar73._0_4_ + fVar106 * auVar76._0_4_;
              local_1520._4_4_ =
                   local_16c0._4_4_ * auVar20._4_4_ +
                   fStack_167c * auVar73._4_4_ + fVar106 * auVar76._4_4_;
              local_1520._8_4_ =
                   local_16c0._4_4_ * auVar20._8_4_ +
                   fStack_167c * auVar73._8_4_ + fVar106 * auVar76._8_4_;
              local_1520._12_4_ =
                   local_16c0._4_4_ * auVar20._12_4_ +
                   fStack_167c * auVar73._12_4_ + fVar106 * auVar76._12_4_;
              local_1520._16_4_ =
                   local_16c0._4_4_ * auVar20._16_4_ +
                   fStack_167c * auVar73._16_4_ + fVar106 * auVar76._16_4_;
              local_1520._20_4_ =
                   local_16c0._4_4_ * auVar20._20_4_ +
                   fStack_167c * auVar73._20_4_ + fVar106 * auVar76._20_4_;
              local_1520._24_4_ =
                   local_16c0._4_4_ * auVar20._24_4_ +
                   fStack_167c * auVar73._24_4_ + fVar106 * auVar76._24_4_;
              local_1520._28_4_ = auVar73._28_4_ + auVar73._28_4_ + auVar76._28_4_;
              auVar20 = vsubps_avx(local_1460,auVar15);
              local_1500 = vsubps_avx(local_1480,auVar16);
              fVar115 = fVar105 + auVar15._0_4_;
              fVar117 = fVar114 + auVar15._4_4_;
              fVar118 = fVar10 + auVar15._8_4_;
              fVar119 = fVar79 + auVar15._12_4_;
              fVar120 = fVar81 + auVar15._16_4_;
              fVar121 = fVar83 + auVar15._20_4_;
              fVar130 = fVar13 + auVar15._24_4_;
              fVar113 = auVar15._28_4_;
              fVar132 = fVar220 + auVar16._0_4_;
              fVar133 = fVar224 + auVar16._4_4_;
              fVar134 = fVar226 + auVar16._8_4_;
              fVar135 = fVar228 + auVar16._12_4_;
              fVar136 = fVar230 + auVar16._16_4_;
              fVar177 = fVar232 + auVar16._20_4_;
              fVar182 = fVar234 + auVar16._24_4_;
              fVar201 = local_1500._0_4_;
              fVar205 = local_1500._4_4_;
              auVar27._4_4_ = fVar205 * fVar117;
              auVar27._0_4_ = fVar201 * fVar115;
              fVar207 = local_1500._8_4_;
              auVar27._8_4_ = fVar207 * fVar118;
              fVar209 = local_1500._12_4_;
              auVar27._12_4_ = fVar209 * fVar119;
              fVar211 = local_1500._16_4_;
              auVar27._16_4_ = fVar211 * fVar120;
              fVar213 = local_1500._20_4_;
              auVar27._20_4_ = fVar213 * fVar121;
              fVar215 = local_1500._24_4_;
              auVar27._24_4_ = fVar215 * fVar130;
              auVar27._28_4_ = fVar91;
              fVar160 = auVar20._0_4_;
              fVar165 = auVar20._4_4_;
              auVar28._4_4_ = fVar165 * fVar133;
              auVar28._0_4_ = fVar160 * fVar132;
              fVar167 = auVar20._8_4_;
              auVar28._8_4_ = fVar167 * fVar134;
              fVar169 = auVar20._12_4_;
              auVar28._12_4_ = fVar169 * fVar135;
              fVar171 = auVar20._16_4_;
              auVar28._16_4_ = fVar171 * fVar136;
              fVar173 = auVar20._20_4_;
              auVar28._20_4_ = fVar173 * fVar177;
              fVar175 = auVar20._24_4_;
              auVar28._24_4_ = fVar175 * fVar182;
              auVar28._28_4_ = fVar74;
              auVar73 = vsubps_avx(auVar28,auVar27);
              auVar76 = vsubps_avx(local_1440,auVar86);
              fVar221 = auVar76._0_4_;
              fVar225 = auVar76._4_4_;
              auVar29._4_4_ = fVar225 * fVar133;
              auVar29._0_4_ = fVar221 * fVar132;
              fVar227 = auVar76._8_4_;
              auVar29._8_4_ = fVar227 * fVar134;
              fVar229 = auVar76._12_4_;
              auVar29._12_4_ = fVar229 * fVar135;
              fVar231 = auVar76._16_4_;
              auVar29._16_4_ = fVar231 * fVar136;
              fVar233 = auVar76._20_4_;
              auVar29._20_4_ = fVar233 * fVar177;
              fVar235 = auVar76._24_4_;
              auVar29._24_4_ = fVar235 * fVar182;
              auVar29._28_4_ = fVar91 + auVar16._28_4_;
              fVar132 = fVar112 + auVar86._0_4_;
              fVar133 = fVar116 + auVar86._4_4_;
              fVar134 = fVar11 + auVar86._8_4_;
              fVar135 = fVar80 + auVar86._12_4_;
              fVar136 = fVar82 + auVar86._16_4_;
              fVar177 = fVar12 + auVar86._20_4_;
              fVar182 = fVar14 + auVar86._24_4_;
              fVar188 = local_1440._28_4_ + auVar86._28_4_;
              auVar30._4_4_ = fVar205 * fVar133;
              auVar30._0_4_ = fVar201 * fVar132;
              auVar30._8_4_ = fVar207 * fVar134;
              auVar30._12_4_ = fVar209 * fVar135;
              auVar30._16_4_ = fVar211 * fVar136;
              auVar30._20_4_ = fVar213 * fVar177;
              auVar30._24_4_ = fVar215 * fVar182;
              auVar30._28_4_ = local_1500._28_4_;
              auVar76 = vsubps_avx(auVar30,auVar29);
              auVar31._4_4_ = fVar165 * fVar133;
              auVar31._0_4_ = fVar160 * fVar132;
              auVar31._8_4_ = fVar167 * fVar134;
              auVar31._12_4_ = fVar169 * fVar135;
              auVar31._16_4_ = fVar171 * fVar136;
              auVar31._20_4_ = fVar173 * fVar177;
              auVar31._24_4_ = fVar175 * fVar182;
              auVar31._28_4_ = fVar188;
              auVar32._4_4_ = fVar225 * fVar117;
              auVar32._0_4_ = fVar221 * fVar115;
              auVar32._8_4_ = fVar227 * fVar118;
              auVar32._12_4_ = fVar229 * fVar119;
              auVar32._16_4_ = fVar231 * fVar120;
              auVar32._20_4_ = fVar233 * fVar121;
              auVar32._24_4_ = fVar235 * fVar130;
              auVar32._28_4_ = fVar74 + fVar113;
              auVar87 = vsubps_avx(auVar32,auVar31);
              local_1540._0_4_ =
                   local_16c0._4_4_ * auVar73._0_4_ +
                   fStack_167c * auVar76._0_4_ + fVar106 * auVar87._0_4_;
              local_1540._4_4_ =
                   local_16c0._4_4_ * auVar73._4_4_ +
                   fStack_167c * auVar76._4_4_ + fVar106 * auVar87._4_4_;
              local_1540._8_4_ =
                   local_16c0._4_4_ * auVar73._8_4_ +
                   fStack_167c * auVar76._8_4_ + fVar106 * auVar87._8_4_;
              local_1540._12_4_ =
                   local_16c0._4_4_ * auVar73._12_4_ +
                   fStack_167c * auVar76._12_4_ + fVar106 * auVar87._12_4_;
              local_1540._16_4_ =
                   local_16c0._4_4_ * auVar73._16_4_ +
                   fStack_167c * auVar76._16_4_ + fVar106 * auVar87._16_4_;
              local_1540._20_4_ =
                   local_16c0._4_4_ * auVar73._20_4_ +
                   fStack_167c * auVar76._20_4_ + fVar106 * auVar87._20_4_;
              local_1540._24_4_ =
                   local_16c0._4_4_ * auVar73._24_4_ +
                   fStack_167c * auVar76._24_4_ + fVar106 * auVar87._24_4_;
              local_1540._28_4_ = auVar73._28_4_ + auVar76._28_4_ + auVar87._28_4_;
              auVar73 = vsubps_avx(auVar86,auVar17);
              fVar182 = auVar86._0_4_ + auVar17._0_4_;
              fVar183 = auVar86._4_4_ + auVar17._4_4_;
              fVar184 = auVar86._8_4_ + auVar17._8_4_;
              fVar185 = auVar86._12_4_ + auVar17._12_4_;
              fVar186 = auVar86._16_4_ + auVar17._16_4_;
              fVar187 = auVar86._20_4_ + auVar17._20_4_;
              fVar91 = auVar86._24_4_ + auVar17._24_4_;
              fVar92 = auVar86._28_4_ + auVar17._28_4_;
              auVar86 = vsubps_avx(auVar15,auVar18);
              fVar130 = auVar15._0_4_ + auVar18._0_4_;
              fVar132 = auVar15._4_4_ + auVar18._4_4_;
              fVar133 = auVar15._8_4_ + auVar18._8_4_;
              fVar134 = auVar15._12_4_ + auVar18._12_4_;
              fVar135 = auVar15._16_4_ + auVar18._16_4_;
              fVar136 = auVar15._20_4_ + auVar18._20_4_;
              fVar177 = auVar15._24_4_ + auVar18._24_4_;
              auVar17 = vsubps_avx(auVar16,auVar19);
              fVar93 = auVar16._0_4_ + auVar19._0_4_;
              fVar99 = auVar16._4_4_ + auVar19._4_4_;
              fVar100 = auVar16._8_4_ + auVar19._8_4_;
              fVar101 = auVar16._12_4_ + auVar19._12_4_;
              fVar102 = auVar16._16_4_ + auVar19._16_4_;
              fVar103 = auVar16._20_4_ + auVar19._20_4_;
              fVar104 = auVar16._24_4_ + auVar19._24_4_;
              fVar74 = auVar17._0_4_;
              fVar115 = auVar17._4_4_;
              auVar33._4_4_ = fVar115 * fVar132;
              auVar33._0_4_ = fVar74 * fVar130;
              fVar117 = auVar17._8_4_;
              auVar33._8_4_ = fVar117 * fVar133;
              fVar118 = auVar17._12_4_;
              auVar33._12_4_ = fVar118 * fVar134;
              fVar119 = auVar17._16_4_;
              auVar33._16_4_ = fVar119 * fVar135;
              fVar120 = auVar17._20_4_;
              auVar33._20_4_ = fVar120 * fVar136;
              fVar121 = auVar17._24_4_;
              auVar33._24_4_ = fVar121 * fVar177;
              auVar33._28_4_ = fVar113;
              fVar161 = auVar86._0_4_;
              fVar166 = auVar86._4_4_;
              auVar34._4_4_ = fVar166 * fVar99;
              auVar34._0_4_ = fVar161 * fVar93;
              fVar168 = auVar86._8_4_;
              auVar34._8_4_ = fVar168 * fVar100;
              fVar170 = auVar86._12_4_;
              auVar34._12_4_ = fVar170 * fVar101;
              fVar172 = auVar86._16_4_;
              auVar34._16_4_ = fVar172 * fVar102;
              fVar174 = auVar86._20_4_;
              auVar34._20_4_ = fVar174 * fVar103;
              fVar176 = auVar86._24_4_;
              auVar34._24_4_ = fVar176 * fVar104;
              auVar34._28_4_ = fVar188;
              auVar86 = vsubps_avx(auVar34,auVar33);
              fVar122 = auVar73._0_4_;
              fVar131 = auVar73._4_4_;
              auVar35._4_4_ = fVar131 * fVar99;
              auVar35._0_4_ = fVar122 * fVar93;
              fVar93 = auVar73._8_4_;
              auVar35._8_4_ = fVar93 * fVar100;
              fVar99 = auVar73._12_4_;
              auVar35._12_4_ = fVar99 * fVar101;
              fVar100 = auVar73._16_4_;
              auVar35._16_4_ = fVar100 * fVar102;
              fVar101 = auVar73._20_4_;
              auVar35._20_4_ = fVar101 * fVar103;
              fVar102 = auVar73._24_4_;
              auVar35._24_4_ = fVar102 * fVar104;
              auVar35._28_4_ = auVar16._28_4_ + auVar19._28_4_;
              auVar36._4_4_ = fVar115 * fVar183;
              auVar36._0_4_ = fVar74 * fVar182;
              auVar36._8_4_ = fVar117 * fVar184;
              auVar36._12_4_ = fVar118 * fVar185;
              auVar36._16_4_ = fVar119 * fVar186;
              auVar36._20_4_ = fVar120 * fVar187;
              auVar36._24_4_ = fVar121 * fVar91;
              auVar36._28_4_ = fVar188;
              auVar15 = vsubps_avx(auVar36,auVar35);
              auVar37._4_4_ = fVar166 * fVar183;
              auVar37._0_4_ = fVar161 * fVar182;
              auVar37._8_4_ = fVar168 * fVar184;
              auVar37._12_4_ = fVar170 * fVar185;
              auVar37._16_4_ = fVar172 * fVar186;
              auVar37._20_4_ = fVar174 * fVar187;
              auVar37._24_4_ = fVar176 * fVar91;
              auVar37._28_4_ = fVar92;
              auVar38._4_4_ = fVar131 * fVar132;
              auVar38._0_4_ = fVar122 * fVar130;
              auVar38._8_4_ = fVar93 * fVar133;
              auVar38._12_4_ = fVar99 * fVar134;
              auVar38._16_4_ = fVar100 * fVar135;
              auVar38._20_4_ = fVar101 * fVar136;
              auVar38._24_4_ = fVar102 * fVar177;
              auVar38._28_4_ = fVar113 + auVar18._28_4_;
              auVar16 = vsubps_avx(auVar38,auVar37);
              local_1680 = fStack_167c;
              fStack_1678 = fStack_167c;
              fStack_1674 = fStack_167c;
              fStack_1670 = fStack_167c;
              fStack_166c = fStack_167c;
              fStack_1668 = fStack_167c;
              fStack_1664 = fStack_167c;
              local_16c0._0_4_ = local_16c0._4_4_;
              fStack_16b8 = local_16c0._4_4_;
              fStack_16b4 = local_16c0._4_4_;
              fStack_16b0 = local_16c0._4_4_;
              fStack_16ac = local_16c0._4_4_;
              fStack_16a8 = local_16c0._4_4_;
              fStack_16a4 = local_16c0._4_4_;
              auVar77._0_4_ =
                   local_16c0._4_4_ * auVar86._0_4_ +
                   fStack_167c * auVar15._0_4_ + fVar106 * auVar16._0_4_;
              auVar77._4_4_ =
                   local_16c0._4_4_ * auVar86._4_4_ +
                   fStack_167c * auVar15._4_4_ + fVar106 * auVar16._4_4_;
              auVar77._8_4_ =
                   local_16c0._4_4_ * auVar86._8_4_ +
                   fStack_167c * auVar15._8_4_ + fVar106 * auVar16._8_4_;
              auVar77._12_4_ =
                   local_16c0._4_4_ * auVar86._12_4_ +
                   fStack_167c * auVar15._12_4_ + fVar106 * auVar16._12_4_;
              auVar77._16_4_ =
                   local_16c0._4_4_ * auVar86._16_4_ +
                   fStack_167c * auVar15._16_4_ + fVar106 * auVar16._16_4_;
              auVar77._20_4_ =
                   local_16c0._4_4_ * auVar86._20_4_ +
                   fStack_167c * auVar15._20_4_ + fVar106 * auVar16._20_4_;
              auVar77._24_4_ =
                   local_16c0._4_4_ * auVar86._24_4_ +
                   fStack_167c * auVar15._24_4_ + fVar106 * auVar16._24_4_;
              auVar77._28_4_ = fVar92 + fVar92 + auVar16._28_4_;
              local_1380._0_4_ = auVar77._0_4_ + local_1520._0_4_ + local_1540._0_4_;
              local_1380._4_4_ = auVar77._4_4_ + local_1520._4_4_ + local_1540._4_4_;
              local_1380._8_4_ = auVar77._8_4_ + local_1520._8_4_ + local_1540._8_4_;
              local_1380._12_4_ = auVar77._12_4_ + local_1520._12_4_ + local_1540._12_4_;
              local_1380._16_4_ = auVar77._16_4_ + local_1520._16_4_ + local_1540._16_4_;
              local_1380._20_4_ = auVar77._20_4_ + local_1520._20_4_ + local_1540._20_4_;
              local_1380._24_4_ = auVar77._24_4_ + local_1520._24_4_ + local_1540._24_4_;
              local_1380._28_4_ = auVar77._28_4_ + local_1520._28_4_ + local_1540._28_4_;
              auVar86 = vminps_avx(local_1520,local_1540);
              auVar86 = vminps_avx(auVar86,auVar77);
              auVar98._8_4_ = 0x7fffffff;
              auVar98._0_8_ = 0x7fffffff7fffffff;
              auVar98._12_4_ = 0x7fffffff;
              auVar98._16_4_ = 0x7fffffff;
              auVar98._20_4_ = 0x7fffffff;
              auVar98._24_4_ = 0x7fffffff;
              auVar98._28_4_ = 0x7fffffff;
              local_1560 = vandps_avx(local_1380,auVar98);
              fVar113 = local_1560._0_4_ * 1.1920929e-07;
              fVar130 = local_1560._4_4_ * 1.1920929e-07;
              auVar39._4_4_ = fVar130;
              auVar39._0_4_ = fVar113;
              fVar132 = local_1560._8_4_ * 1.1920929e-07;
              auVar39._8_4_ = fVar132;
              fVar133 = local_1560._12_4_ * 1.1920929e-07;
              auVar39._12_4_ = fVar133;
              fVar134 = local_1560._16_4_ * 1.1920929e-07;
              auVar39._16_4_ = fVar134;
              fVar135 = local_1560._20_4_ * 1.1920929e-07;
              auVar39._20_4_ = fVar135;
              fVar136 = local_1560._24_4_ * 1.1920929e-07;
              auVar39._24_4_ = fVar136;
              auVar39._28_4_ = 0x34000000;
              auVar179._0_8_ = CONCAT44(fVar130,fVar113) ^ 0x8000000080000000;
              auVar179._8_4_ = -fVar132;
              auVar179._12_4_ = -fVar133;
              auVar179._16_4_ = -fVar134;
              auVar179._20_4_ = -fVar135;
              auVar179._24_4_ = -fVar136;
              auVar179._28_4_ = 0xb4000000;
              auVar86 = vcmpps_avx(auVar86,auVar179,5);
              auVar16 = vmaxps_avx(local_1520,local_1540);
              auVar15 = vmaxps_avx(auVar16,auVar77);
              auVar15 = vcmpps_avx(auVar15,auVar39,2);
              auVar15 = vorps_avx(auVar86,auVar15);
              if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar15 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar15 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar15 >> 0x7f,0) == '\0') &&
                    (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar15 >> 0xbf,0) == '\0') &&
                  (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar15[0x1f]) {
LAB_003119e9:
                auVar181 = ZEXT3264(local_15a0);
                auVar190 = ZEXT3264(local_15c0);
                auVar193 = ZEXT3264(local_15e0);
                auVar203 = ZEXT3264(local_1600);
                auVar217 = ZEXT3264(local_1620);
                auVar219 = ZEXT3264(local_1640);
                auVar223 = ZEXT3264(local_1660);
              }
              else {
                auVar40._4_4_ = fVar165 * fVar145;
                auVar40._0_4_ = fVar160 * fVar137;
                auVar40._8_4_ = fVar167 * fVar146;
                auVar40._12_4_ = fVar169 * fVar147;
                auVar40._16_4_ = fVar171 * fVar148;
                auVar40._20_4_ = fVar173 * fVar149;
                auVar40._24_4_ = fVar175 * fVar150;
                auVar40._28_4_ = auVar86._28_4_;
                auVar41._4_4_ = fVar204 * fVar205;
                auVar41._0_4_ = fVar200 * fVar201;
                auVar41._8_4_ = fVar206 * fVar207;
                auVar41._12_4_ = fVar208 * fVar209;
                auVar41._16_4_ = fVar210 * fVar211;
                auVar41._20_4_ = fVar212 * fVar213;
                auVar41._24_4_ = fVar214 * fVar215;
                auVar41._28_4_ = 0x34000000;
                auVar18 = vsubps_avx(auVar41,auVar40);
                auVar42._4_4_ = fVar205 * fVar166;
                auVar42._0_4_ = fVar201 * fVar161;
                auVar42._8_4_ = fVar207 * fVar168;
                auVar42._12_4_ = fVar209 * fVar170;
                auVar42._16_4_ = fVar211 * fVar172;
                auVar42._20_4_ = fVar213 * fVar174;
                auVar42._24_4_ = fVar215 * fVar176;
                auVar42._28_4_ = auVar16._28_4_;
                auVar43._4_4_ = fVar165 * fVar115;
                auVar43._0_4_ = fVar160 * fVar74;
                auVar43._8_4_ = fVar167 * fVar117;
                auVar43._12_4_ = fVar169 * fVar118;
                auVar43._16_4_ = fVar171 * fVar119;
                auVar43._20_4_ = fVar173 * fVar120;
                auVar43._24_4_ = fVar175 * fVar121;
                auVar43._28_4_ = auVar20._28_4_;
                auVar19 = vsubps_avx(auVar43,auVar42);
                auVar111._8_4_ = 0x7fffffff;
                auVar111._0_8_ = 0x7fffffff7fffffff;
                auVar111._12_4_ = 0x7fffffff;
                auVar111._16_4_ = 0x7fffffff;
                auVar111._20_4_ = 0x7fffffff;
                auVar111._24_4_ = 0x7fffffff;
                auVar111._28_4_ = 0x7fffffff;
                auVar86 = vandps_avx(auVar40,auVar111);
                auVar16 = vandps_avx(auVar42,auVar111);
                auVar86 = vcmpps_avx(auVar86,auVar16,1);
                local_1360 = vblendvps_avx(auVar19,auVar18,auVar86);
                auVar44._4_4_ = fVar225 * fVar115;
                auVar44._0_4_ = fVar221 * fVar74;
                auVar44._8_4_ = fVar227 * fVar117;
                auVar44._12_4_ = fVar229 * fVar118;
                auVar44._16_4_ = fVar231 * fVar119;
                auVar44._20_4_ = fVar233 * fVar120;
                auVar44._24_4_ = fVar235 * fVar121;
                auVar44._28_4_ = auVar86._28_4_;
                auVar45._4_4_ = fVar225 * fVar145;
                auVar45._0_4_ = fVar221 * fVar137;
                auVar45._8_4_ = fVar227 * fVar146;
                auVar45._12_4_ = fVar229 * fVar147;
                auVar45._16_4_ = fVar231 * fVar148;
                auVar45._20_4_ = fVar233 * fVar149;
                auVar45._24_4_ = fVar235 * fVar150;
                auVar45._28_4_ = auVar18._28_4_;
                auVar46._4_4_ = fVar194 * fVar205;
                auVar46._0_4_ = fVar191 * fVar201;
                auVar46._8_4_ = fVar195 * fVar207;
                auVar46._12_4_ = fVar196 * fVar209;
                auVar46._16_4_ = fVar197 * fVar211;
                auVar46._20_4_ = fVar198 * fVar213;
                auVar46._24_4_ = fVar199 * fVar215;
                auVar46._28_4_ = local_14e0._28_4_;
                auVar18 = vsubps_avx(auVar45,auVar46);
                auVar47._4_4_ = fVar205 * fVar131;
                auVar47._0_4_ = fVar201 * fVar122;
                auVar47._8_4_ = fVar207 * fVar93;
                auVar47._12_4_ = fVar209 * fVar99;
                auVar47._16_4_ = fVar211 * fVar100;
                auVar47._20_4_ = fVar213 * fVar101;
                auVar47._24_4_ = fVar215 * fVar102;
                auVar47._28_4_ = local_1500._28_4_;
                auVar19 = vsubps_avx(auVar47,auVar44);
                auVar86 = vandps_avx(auVar46,auVar111);
                auVar16 = vandps_avx(auVar44,auVar111);
                auVar86 = vcmpps_avx(auVar86,auVar16,1);
                local_1340 = vblendvps_avx(auVar19,auVar18,auVar86);
                auVar48._4_4_ = fVar165 * fVar131;
                auVar48._0_4_ = fVar160 * fVar122;
                auVar48._8_4_ = fVar167 * fVar93;
                auVar48._12_4_ = fVar169 * fVar99;
                auVar48._16_4_ = fVar171 * fVar100;
                auVar48._20_4_ = fVar173 * fVar101;
                auVar48._24_4_ = fVar175 * fVar102;
                auVar48._28_4_ = auVar86._28_4_;
                auVar49._4_4_ = fVar194 * fVar165;
                auVar49._0_4_ = fVar191 * fVar160;
                auVar49._8_4_ = fVar195 * fVar167;
                auVar49._12_4_ = fVar196 * fVar169;
                auVar49._16_4_ = fVar197 * fVar171;
                auVar49._20_4_ = fVar198 * fVar173;
                auVar49._24_4_ = fVar199 * fVar175;
                auVar49._28_4_ = auVar18._28_4_;
                auVar50._4_4_ = fVar204 * fVar225;
                auVar50._0_4_ = fVar200 * fVar221;
                auVar50._8_4_ = fVar206 * fVar227;
                auVar50._12_4_ = fVar208 * fVar229;
                auVar50._16_4_ = fVar210 * fVar231;
                auVar50._20_4_ = fVar212 * fVar233;
                auVar50._24_4_ = fVar214 * fVar235;
                auVar50._28_4_ = auVar73._28_4_;
                auVar51._4_4_ = fVar225 * fVar166;
                auVar51._0_4_ = fVar221 * fVar161;
                auVar51._8_4_ = fVar227 * fVar168;
                auVar51._12_4_ = fVar229 * fVar170;
                auVar51._16_4_ = fVar231 * fVar172;
                auVar51._20_4_ = fVar233 * fVar174;
                auVar51._24_4_ = fVar235 * fVar176;
                auVar51._28_4_ = auVar17._28_4_;
                auVar17 = vsubps_avx(auVar49,auVar50);
                auVar18 = vsubps_avx(auVar51,auVar48);
                auVar86 = vandps_avx(auVar50,auVar111);
                auVar16 = vandps_avx(auVar48,auVar111);
                auVar86 = vcmpps_avx(auVar86,auVar16,1);
                local_1320 = vblendvps_avx(auVar18,auVar17,auVar86);
                auVar72 = vpackssdw_avx(auVar15._0_16_,auVar15._16_16_);
                fVar121 = local_1320._0_4_;
                fVar130 = local_1320._4_4_;
                fVar132 = local_1320._8_4_;
                fVar133 = local_1320._12_4_;
                fVar134 = local_1320._16_4_;
                fVar135 = local_1320._20_4_;
                fVar136 = local_1320._24_4_;
                fVar177 = local_1340._0_4_;
                fVar182 = local_1340._4_4_;
                fVar183 = local_1340._8_4_;
                fVar184 = local_1340._12_4_;
                fVar185 = local_1340._16_4_;
                fVar186 = local_1340._20_4_;
                fVar187 = local_1340._24_4_;
                fVar91 = local_1360._0_4_;
                fVar92 = local_1360._4_4_;
                fVar93 = local_1360._8_4_;
                fVar99 = local_1360._12_4_;
                fVar100 = local_1360._16_4_;
                fVar101 = local_1360._20_4_;
                fVar102 = local_1360._24_4_;
                fVar74 = fVar91 * local_16c0._4_4_ + fVar177 * fStack_167c + fVar121 * fVar106;
                fVar113 = fVar92 * local_16c0._4_4_ + fVar182 * fStack_167c + fVar130 * fVar106;
                fVar115 = fVar93 * local_16c0._4_4_ + fVar183 * fStack_167c + fVar132 * fVar106;
                fVar117 = fVar99 * local_16c0._4_4_ + fVar184 * fStack_167c + fVar133 * fVar106;
                fVar118 = fVar100 * local_16c0._4_4_ + fVar185 * fStack_167c + fVar134 * fVar106;
                fVar119 = fVar101 * local_16c0._4_4_ + fVar186 * fStack_167c + fVar135 * fVar106;
                fVar106 = fVar102 * local_16c0._4_4_ + fVar187 * fStack_167c + fVar136 * fVar106;
                fVar120 = auVar86._28_4_ + auVar86._28_4_ + auVar15._28_4_;
                auVar89._0_4_ = fVar74 + fVar74;
                auVar89._4_4_ = fVar113 + fVar113;
                auVar89._8_4_ = fVar115 + fVar115;
                auVar89._12_4_ = fVar117 + fVar117;
                auVar89._16_4_ = fVar118 + fVar118;
                auVar89._20_4_ = fVar119 + fVar119;
                auVar89._24_4_ = fVar106 + fVar106;
                auVar89._28_4_ = fVar120 + fVar120;
                fVar74 = auVar17._28_4_;
                auVar86 = vrcpps_avx(auVar89);
                fVar113 = fVar91 * fVar112 + fVar177 * fVar105 + fVar121 * fVar220;
                fVar115 = fVar92 * fVar116 + fVar182 * fVar114 + fVar130 * fVar224;
                fVar117 = fVar93 * fVar11 + fVar183 * fVar10 + fVar132 * fVar226;
                fVar79 = fVar99 * fVar80 + fVar184 * fVar79 + fVar133 * fVar228;
                fVar80 = fVar100 * fVar82 + fVar185 * fVar81 + fVar134 * fVar230;
                fVar81 = fVar101 * fVar12 + fVar186 * fVar83 + fVar135 * fVar232;
                fVar82 = fVar102 * fVar14 + fVar187 * fVar13 + fVar136 * fVar234;
                fVar83 = fVar74 + fVar74 + fVar120;
                fVar83 = fVar83 + fVar83;
                fVar106 = auVar86._0_4_;
                fVar105 = auVar86._4_4_;
                auVar52._4_4_ = auVar89._4_4_ * fVar105;
                auVar52._0_4_ = auVar89._0_4_ * fVar106;
                fVar112 = auVar86._8_4_;
                auVar52._8_4_ = auVar89._8_4_ * fVar112;
                fVar114 = auVar86._12_4_;
                auVar52._12_4_ = auVar89._12_4_ * fVar114;
                fVar116 = auVar86._16_4_;
                auVar52._16_4_ = auVar89._16_4_ * fVar116;
                fVar10 = auVar86._20_4_;
                auVar52._20_4_ = auVar89._20_4_ * fVar10;
                fVar11 = auVar86._24_4_;
                auVar52._24_4_ = auVar89._24_4_ * fVar11;
                auVar52._28_4_ = fVar74;
                auVar180._8_4_ = 0x3f800000;
                auVar180._0_8_ = &DAT_3f8000003f800000;
                auVar180._12_4_ = 0x3f800000;
                auVar180._16_4_ = 0x3f800000;
                auVar180._20_4_ = 0x3f800000;
                auVar180._24_4_ = 0x3f800000;
                auVar180._28_4_ = 0x3f800000;
                auVar86 = vsubps_avx(auVar180,auVar52);
                uVar65 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
                auVar142._4_4_ = uVar65;
                auVar142._0_4_ = uVar65;
                auVar142._8_4_ = uVar65;
                auVar142._12_4_ = uVar65;
                auVar142._16_4_ = uVar65;
                auVar142._20_4_ = uVar65;
                auVar142._24_4_ = uVar65;
                auVar142._28_4_ = uVar65;
                local_12a0._4_4_ = (fVar115 + fVar115) * (fVar105 + fVar105 * auVar86._4_4_);
                local_12a0._0_4_ = (fVar113 + fVar113) * (fVar106 + fVar106 * auVar86._0_4_);
                local_12a0._8_4_ = (fVar117 + fVar117) * (fVar112 + fVar112 * auVar86._8_4_);
                local_12a0._12_4_ = (fVar79 + fVar79) * (fVar114 + fVar114 * auVar86._12_4_);
                local_12a0._16_4_ = (fVar80 + fVar80) * (fVar116 + fVar116 * auVar86._16_4_);
                local_12a0._20_4_ = (fVar81 + fVar81) * (fVar10 + fVar10 * auVar86._20_4_);
                local_12a0._24_4_ = (fVar82 + fVar82) * (fVar11 + fVar11 * auVar86._24_4_);
                local_12a0._28_4_ = fVar83;
                auVar86 = vcmpps_avx(auVar142,local_12a0,2);
                fVar106 = ray->tfar;
                auVar143._4_4_ = fVar106;
                auVar143._0_4_ = fVar106;
                auVar143._8_4_ = fVar106;
                auVar143._12_4_ = fVar106;
                auVar143._16_4_ = fVar106;
                auVar143._20_4_ = fVar106;
                auVar143._24_4_ = fVar106;
                auVar143._28_4_ = fVar106;
                auVar15 = vcmpps_avx(local_12a0,auVar143,2);
                auVar86 = vandps_avx(auVar15,auVar86);
                auVar15 = vcmpps_avx(auVar89,_DAT_02020f00,4);
                auVar86 = vandps_avx(auVar86,auVar15);
                auVar71 = vpackssdw_avx(auVar86._0_16_,auVar86._16_16_);
                auVar72 = vpand_avx(auVar71,auVar72);
                auVar71 = vpmovsxwd_avx(auVar72);
                auVar123 = vpshufd_avx(auVar72,0xee);
                auVar123 = vpmovsxwd_avx(auVar123);
                local_1300._16_16_ = auVar123;
                local_1300._0_16_ = auVar71;
                if ((((((((local_1300 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_1300 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_1300 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_1300 >> 0x7f,0) == '\0') &&
                      (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB161(auVar123 >> 0x3f,0) == '\0') &&
                    (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar123[0xf]) goto LAB_003119e9;
                local_13c0 = local_1520._0_4_;
                fStack_13bc = local_1520._4_4_;
                fStack_13b8 = local_1520._8_4_;
                fStack_13b4 = local_1520._12_4_;
                fStack_13b0 = local_1520._16_4_;
                fStack_13ac = local_1520._20_4_;
                fStack_13a8 = local_1520._24_4_;
                fStack_13a4 = local_1520._28_4_;
                local_13a0 = local_1540._0_4_;
                fStack_139c = local_1540._4_4_;
                fStack_1398 = local_1540._8_4_;
                fStack_1394 = local_1540._12_4_;
                fStack_1390 = local_1540._16_4_;
                fStack_138c = local_1540._20_4_;
                fStack_1388 = local_1540._24_4_;
                fStack_1384 = local_1540._28_4_;
                auVar86 = vrcpps_avx(local_1380);
                local_1220 = local_1580;
                fVar106 = auVar86._0_4_;
                fVar105 = auVar86._4_4_;
                auVar53._4_4_ = local_1380._4_4_ * fVar105;
                auVar53._0_4_ = local_1380._0_4_ * fVar106;
                fVar112 = auVar86._8_4_;
                auVar53._8_4_ = local_1380._8_4_ * fVar112;
                fVar114 = auVar86._12_4_;
                auVar53._12_4_ = local_1380._12_4_ * fVar114;
                fVar116 = auVar86._16_4_;
                auVar53._16_4_ = local_1380._16_4_ * fVar116;
                fVar10 = auVar86._20_4_;
                auVar53._20_4_ = local_1380._20_4_ * fVar10;
                fVar11 = auVar86._24_4_;
                auVar53._24_4_ = local_1380._24_4_ * fVar11;
                auVar53._28_4_ = fVar83;
                auVar159._8_4_ = 0x3f800000;
                auVar159._0_8_ = &DAT_3f8000003f800000;
                auVar159._12_4_ = 0x3f800000;
                auVar159._16_4_ = 0x3f800000;
                auVar159._20_4_ = 0x3f800000;
                auVar159._24_4_ = 0x3f800000;
                auVar159._28_4_ = 0x3f800000;
                auVar15 = vsubps_avx(auVar159,auVar53);
                auVar78._0_4_ = fVar106 + fVar106 * auVar15._0_4_;
                auVar78._4_4_ = fVar105 + fVar105 * auVar15._4_4_;
                auVar78._8_4_ = fVar112 + fVar112 * auVar15._8_4_;
                auVar78._12_4_ = fVar114 + fVar114 * auVar15._12_4_;
                auVar78._16_4_ = fVar116 + fVar116 * auVar15._16_4_;
                auVar78._20_4_ = fVar10 + fVar10 * auVar15._20_4_;
                auVar78._24_4_ = fVar11 + fVar11 * auVar15._24_4_;
                auVar78._28_4_ = auVar86._28_4_ + auVar15._28_4_;
                auVar90._8_4_ = 0x219392ef;
                auVar90._0_8_ = 0x219392ef219392ef;
                auVar90._12_4_ = 0x219392ef;
                auVar90._16_4_ = 0x219392ef;
                auVar90._20_4_ = 0x219392ef;
                auVar90._24_4_ = 0x219392ef;
                auVar90._28_4_ = 0x219392ef;
                auVar15 = vcmpps_avx(local_1560,auVar90,5);
                auVar86 = vandps_avx(auVar15,auVar78);
                auVar54._4_4_ = local_1520._4_4_ * auVar86._4_4_;
                auVar54._0_4_ = local_1520._0_4_ * auVar86._0_4_;
                auVar54._8_4_ = local_1520._8_4_ * auVar86._8_4_;
                auVar54._12_4_ = local_1520._12_4_ * auVar86._12_4_;
                auVar54._16_4_ = local_1520._16_4_ * auVar86._16_4_;
                auVar54._20_4_ = local_1520._20_4_ * auVar86._20_4_;
                auVar54._24_4_ = local_1520._24_4_ * auVar86._24_4_;
                auVar54._28_4_ = auVar15._28_4_;
                auVar15 = vminps_avx(auVar54,auVar159);
                auVar55._4_4_ = local_1540._4_4_ * auVar86._4_4_;
                auVar55._0_4_ = local_1540._0_4_ * auVar86._0_4_;
                auVar55._8_4_ = local_1540._8_4_ * auVar86._8_4_;
                auVar55._12_4_ = local_1540._12_4_ * auVar86._12_4_;
                auVar55._16_4_ = local_1540._16_4_ * auVar86._16_4_;
                auVar55._20_4_ = local_1540._20_4_ * auVar86._20_4_;
                auVar55._24_4_ = local_1540._24_4_ * auVar86._24_4_;
                auVar55._28_4_ = auVar86._28_4_;
                auVar16 = vminps_avx(auVar55,auVar159);
                auVar17 = vsubps_avx(auVar159,auVar15);
                auVar18 = vsubps_avx(auVar159,auVar16);
                auVar144._8_4_ = 0xbf800000;
                auVar144._0_8_ = 0xbf800000bf800000;
                auVar144._12_4_ = 0xbf800000;
                auVar144._16_4_ = 0xbf800000;
                auVar144._20_4_ = 0xbf800000;
                auVar144._24_4_ = 0xbf800000;
                auVar144._28_4_ = 0xbf800000;
                auVar86 = vblendvps_avx(auVar159,auVar144,local_1580);
                local_12c0 = vblendvps_avx(auVar16,auVar17,local_1580);
                local_12e0 = vblendvps_avx(auVar15,auVar18,local_1580);
                fVar106 = auVar86._0_4_;
                fVar105 = auVar86._4_4_;
                local_1280._4_4_ = fVar92 * fVar105;
                local_1280._0_4_ = fVar91 * fVar106;
                fVar112 = auVar86._8_4_;
                local_1280._8_4_ = fVar93 * fVar112;
                fVar114 = auVar86._12_4_;
                local_1280._12_4_ = fVar99 * fVar114;
                fVar116 = auVar86._16_4_;
                local_1280._16_4_ = fVar100 * fVar116;
                fVar10 = auVar86._20_4_;
                local_1280._20_4_ = fVar101 * fVar10;
                fVar11 = auVar86._24_4_;
                local_1280._24_4_ = fVar102 * fVar11;
                local_1280._28_4_ = local_12c0._28_4_;
                local_1260._4_4_ = fVar182 * fVar105;
                local_1260._0_4_ = fVar177 * fVar106;
                local_1260._8_4_ = fVar183 * fVar112;
                local_1260._12_4_ = fVar184 * fVar114;
                local_1260._16_4_ = fVar185 * fVar116;
                local_1260._20_4_ = fVar186 * fVar10;
                local_1260._24_4_ = fVar187 * fVar11;
                local_1260._28_4_ = local_12e0._28_4_;
                local_1240._4_4_ = fVar105 * fVar130;
                local_1240._0_4_ = fVar106 * fVar121;
                local_1240._8_4_ = fVar112 * fVar132;
                local_1240._12_4_ = fVar114 * fVar133;
                local_1240._16_4_ = fVar116 * fVar134;
                local_1240._20_4_ = fVar10 * fVar135;
                local_1240._24_4_ = fVar11 * fVar136;
                local_1240._28_4_ = auVar17._28_4_;
                auVar72 = vpsllw_avx(auVar72,0xf);
                auVar72 = vpacksswb_avx(auVar72,auVar72);
                uVar66 = (ulong)(byte)(SUB161(auVar72 >> 7,0) & 1 |
                                       (SUB161(auVar72 >> 0xf,0) & 1) << 1 |
                                       (SUB161(auVar72 >> 0x17,0) & 1) << 2 |
                                       (SUB161(auVar72 >> 0x1f,0) & 1) << 3 |
                                       (SUB161(auVar72 >> 0x27,0) & 1) << 4 |
                                       (SUB161(auVar72 >> 0x2f,0) & 1) << 5 |
                                       (SUB161(auVar72 >> 0x37,0) & 1) << 6 |
                                      SUB161(auVar72 >> 0x3f,0) << 7);
                auVar181 = ZEXT3264(local_15a0);
                auVar190 = ZEXT3264(local_15c0);
                auVar193 = ZEXT3264(local_15e0);
                auVar203 = ZEXT3264(local_1600);
                auVar217 = ZEXT3264(local_1620);
                auVar219 = ZEXT3264(local_1640);
                auVar223 = ZEXT3264(local_1660);
                do {
                  uVar63 = 0;
                  if (uVar66 != 0) {
                    for (; (uVar66 >> uVar63 & 1) == 0; uVar63 = uVar63 + 1) {
                    }
                  }
                  local_1708 = *(uint *)((long)&local_13e0 + uVar63 * 4);
                  pGVar8 = (pSVar2->geometries).items[local_1708].ptr;
                  if ((pGVar8->mask & ray->mask) == 0) {
                    uVar66 = uVar66 ^ 1L << (uVar63 & 0x3f);
                    bVar56 = true;
                  }
                  else {
                    pRVar9 = context->args;
                    if ((pRVar9->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                      bVar56 = false;
                    }
                    else {
                      local_1714 = *(undefined4 *)(local_12e0 + uVar63 * 4);
                      local_1710 = *(undefined4 *)(local_12c0 + uVar63 * 4);
                      local_16f0.context = context->user;
                      local_170c = *(undefined4 *)((long)&local_1400 + uVar63 * 4);
                      local_1720 = *(undefined4 *)(local_1280 + uVar63 * 4);
                      local_171c = *(undefined4 *)(local_1260 + uVar63 * 4);
                      local_1718 = *(undefined4 *)(local_1240 + uVar63 * 4);
                      local_1704 = (local_16f0.context)->instID[0];
                      local_1700 = (local_16f0.context)->instPrimID[0];
                      local_1680 = ray->tfar;
                      ray->tfar = *(float *)(local_12a0 + uVar63 * 4);
                      local_175c = -1;
                      local_16f0.valid = &local_175c;
                      local_16f0.geometryUserPtr = pGVar8->userPtr;
                      local_16f0.hit = (RTCHitN *)&local_1720;
                      local_16f0.N = 1;
                      local_16f0.ray = (RTCRayN *)ray;
                      if (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00311900:
                        if (pRVar9->filter != (RTCFilterFunctionN)0x0) {
                          if (((pRVar9->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
                            (*pRVar9->filter)(&local_16f0);
                            auVar223 = ZEXT3264(local_1660);
                            auVar219 = ZEXT3264(local_1640);
                            auVar217 = ZEXT3264(local_1620);
                            auVar203 = ZEXT3264(local_1600);
                            auVar193 = ZEXT3264(local_15e0);
                            auVar190 = ZEXT3264(local_15c0);
                            auVar181 = ZEXT3264(local_15a0);
                          }
                          if (*local_16f0.valid == 0) goto LAB_00311997;
                        }
                        bVar56 = false;
                      }
                      else {
                        local_16a0._0_8_ = context;
                        local_16c0 = ray;
                        (*pGVar8->occlusionFilterN)(&local_16f0);
                        auVar223 = ZEXT3264(local_1660);
                        auVar219 = ZEXT3264(local_1640);
                        auVar217 = ZEXT3264(local_1620);
                        auVar203 = ZEXT3264(local_1600);
                        auVar193 = ZEXT3264(local_15e0);
                        auVar190 = ZEXT3264(local_15c0);
                        auVar181 = ZEXT3264(local_15a0);
                        context = (RayQueryContext *)local_16a0._0_8_;
                        ray = local_16c0;
                        if (*local_16f0.valid != 0) goto LAB_00311900;
LAB_00311997:
                        ray->tfar = local_1680;
                        uVar66 = uVar66 ^ 1L << (uVar63 & 0x3f);
                        bVar56 = true;
                      }
                    }
                  }
                  iVar60 = 0;
                  uVar63 = local_1738;
                  uVar68 = local_1740;
                  uVar69 = local_1748;
                  if (!bVar56) {
                    if (bVar70) {
                      ray->tfar = -INFINITY;
                      iVar60 = 3;
                    }
                    goto LAB_00311a5a;
                  }
                } while (uVar66 != 0);
              }
              local_1728 = local_1728 + 1;
              bVar70 = local_1728 < local_1730;
            } while (local_1728 != local_1730);
            iVar60 = 0;
          }
        }
LAB_00311a5a:
      } while (iVar60 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }